

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandMoveNames(Abc_Frame_t *pAbc,int argc,char **argv)

{
  char *pFileName;
  int iVar1;
  Io_FileType_t FileType;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Abc_Ntk_t *pNtk_00;
  Abc_Ntk_t *pNtk_01;
  int c;
  char *FileName;
  Abc_Ntk_t *pNtk2;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pNtk_00 = Abc_FrameReadNtk(pAbc);
  Extra_UtilGetoptReset();
  iVar1 = Extra_UtilGetopt(argc,argv,"h");
  if (iVar1 == -1) {
    if (argc == globalUtilOptind + 1) {
      pFileName = argv[globalUtilOptind];
      FileType = Io_ReadFileType(pFileName);
      pNtk_01 = Io_Read(pFileName,FileType,1,0);
      if (pNtk_01 == (Abc_Ntk_t *)0x0) {
        pAbc_local._4_4_ = 1;
      }
      else {
        iVar1 = Abc_NtkPiNum(pNtk_00);
        iVar2 = Abc_NtkPiNum(pNtk_01);
        if (iVar1 == iVar2) {
          iVar1 = Abc_NtkPoNum(pNtk_00);
          iVar2 = Abc_NtkPoNum(pNtk_01);
          if (iVar1 == iVar2) {
            iVar1 = Abc_NtkLatchNum(pNtk_00);
            iVar2 = Abc_NtkLatchNum(pNtk_01);
            if (iVar1 == iVar2) {
              Abc_NtkMoveNames(pNtk_00,pNtk_01);
              Abc_NtkDelete(pNtk_01);
              pAbc_local._4_4_ = 0;
            }
            else {
              Abc_NtkDelete(pNtk_01);
              uVar3 = Abc_NtkLatchNum(pNtk_00);
              uVar4 = Abc_NtkLatchNum(pNtk_01);
              Abc_Print(-1,
                        "The flop count (%d) of the first network is not equal to flop count (%d) of the second network.\n"
                        ,(ulong)uVar3,(ulong)uVar4);
              pAbc_local._4_4_ = 0;
            }
          }
          else {
            Abc_NtkDelete(pNtk_01);
            uVar3 = Abc_NtkPoNum(pNtk_00);
            uVar4 = Abc_NtkPoNum(pNtk_01);
            Abc_Print(-1,
                      "The PO count (%d) of the first network is not equal to PO count (%d) of the second network.\n"
                      ,(ulong)uVar3,(ulong)uVar4);
            pAbc_local._4_4_ = 0;
          }
        }
        else {
          Abc_NtkDelete(pNtk_01);
          uVar3 = Abc_NtkPiNum(pNtk_00);
          uVar4 = Abc_NtkPiNum(pNtk_01);
          Abc_Print(-1,
                    "The PI count (%d) of the first network is not equal to PI count (%d) of the second network.\n"
                    ,(ulong)uVar3,(ulong)uVar4);
          pAbc_local._4_4_ = 0;
        }
      }
    }
    else {
      Abc_Print(-1,"The network to take names from is not given.\n");
      pAbc_local._4_4_ = 1;
    }
  }
  else {
    Abc_Print(-2,"usage: move_names [-h] <file>\n");
    Abc_Print(-2,"\t         moves PI/PO/latch names from the other network\n");
    Abc_Print(-2,"\t-h     : print the command usage\n");
    Abc_Print(-2,"\t<file> : file with network that has required names\n");
    pAbc_local._4_4_ = 1;
  }
  return pAbc_local._4_4_;
}

Assistant:

int Abc_CommandMoveNames( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Abc_NtkMoveNames( Abc_Ntk_t * pNtk, Abc_Ntk_t * pOld );
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    Abc_Ntk_t * pNtk2;
    char * FileName;
    int c;
    // set defaults
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "h" ) ) != EOF )
    {
        switch ( c )
        {
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    // get the second network
    if ( argc != globalUtilOptind + 1 )
    {
        Abc_Print( -1, "The network to take names from is not given.\n" );
        return 1;
    }

    // read the second network
    FileName = argv[globalUtilOptind];
    pNtk2 = Io_Read( FileName, Io_ReadFileType(FileName), 1, 0 );
    if ( pNtk2 == NULL )
        return 1;

    // compare inputs/outputs
    if ( Abc_NtkPiNum(pNtk) != Abc_NtkPiNum(pNtk2) )
    {
        Abc_NtkDelete( pNtk2 );
        Abc_Print( -1, "The PI count (%d) of the first network is not equal to PI count (%d) of the second network.\n", Abc_NtkPiNum(pNtk), Abc_NtkPiNum(pNtk2) );
        return 0;
    }
    // compare inputs/outputs
    if ( Abc_NtkPoNum(pNtk) != Abc_NtkPoNum(pNtk2) )
    {
        Abc_NtkDelete( pNtk2 );
        Abc_Print( -1, "The PO count (%d) of the first network is not equal to PO count (%d) of the second network.\n", Abc_NtkPoNum(pNtk), Abc_NtkPoNum(pNtk2) );
        return 0;
    }
    // compare inputs/outputs
    if ( Abc_NtkLatchNum(pNtk) != Abc_NtkLatchNum(pNtk2) )
    {
        Abc_NtkDelete( pNtk2 );
        Abc_Print( -1, "The flop count (%d) of the first network is not equal to flop count (%d) of the second network.\n", Abc_NtkLatchNum(pNtk), Abc_NtkLatchNum(pNtk2) );
        return 0;
    }
    Abc_NtkMoveNames( pNtk, pNtk2 );
    Abc_NtkDelete( pNtk2 );
    return 0;

usage:
    Abc_Print( -2, "usage: move_names [-h] <file>\n" );
    Abc_Print( -2, "\t         moves PI/PO/latch names from the other network\n" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t<file> : file with network that has required names\n");
    return 1;
}